

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cv_mu_timeout_stress_test.c
# Opt level: O0

void mu_stress_reader_loop(cv_stress_data *s,condition_func condition,void *condition_arg)

{
  undefined1 auVar1 [16];
  int iVar2;
  nsync_time nVar3;
  nsync_time nVar4;
  ulong in_stack_ffffffffffffff30;
  nsync *local_c0;
  _func_int_void_ptr_void_ptr *local_90;
  __syscall_slong_t local_88;
  _func_int_void_ptr_void_ptr *local_50;
  __syscall_slong_t local_48;
  _func_int_void_ptr_void_ptr *local_40;
  nsync_time abs_deadline;
  uintmax_t timeouts;
  uintmax_t loops;
  void *condition_arg_local;
  condition_func condition_local;
  cv_stress_data *s_local;
  
  nsync::nsync_mu_rlock(&s->mu);
  nsync::nsync_mu_rassert_held(&s->mu);
  timeouts = 0;
  while (s->refs != 0) {
    nsync::nsync_mu_rassert_held(&s->mu);
    nVar3 = nsync::nsync_time_now();
    iVar2 = rand();
    nVar4 = nsync::nsync_time_us(iVar2 % 4000);
    nVar3 = nsync::nsync_time_add(nVar3,nVar4);
    local_50 = (_func_int_void_ptr_void_ptr *)nVar3.tv_sec;
    local_40 = local_50;
    local_48 = nVar3.tv_nsec;
    abs_deadline.tv_sec = local_48;
    while (auVar1._8_8_ = 0, auVar1._0_8_ = in_stack_ffffffffffffff30,
          iVar2 = nsync::nsync_mu_wait_with_deadline
                            ((nsync *)s,(nsync_mu *)condition,(_func_int_void_ptr *)condition_arg,
                             (void *)0x0,local_40,(nsync_time)(auVar1 << 0x40),
                             (nsync_note)abs_deadline.tv_sec), iVar2 != 0) {
      nsync::nsync_mu_rassert_held(&s->mu);
      s->timeouts = s->timeouts + 1;
      nsync::nsync_mu_rassert_held(&s->mu);
      nVar3 = nsync::nsync_time_now();
      iVar2 = rand();
      nVar4 = nsync::nsync_time_us(iVar2 % 4000);
      nVar3 = nsync::nsync_time_add(nVar3,nVar4);
      local_90 = (_func_int_void_ptr_void_ptr *)nVar3.tv_sec;
      local_40 = local_90;
      local_88 = nVar3.tv_nsec;
      abs_deadline.tv_sec = local_88;
    }
    nsync::nsync_mu_rassert_held(&s->mu);
    timeouts = timeouts + 1;
    if ((timeouts & 0xf) == 0) {
      nsync::nsync_mu_runlock(&s->mu);
      if ((timeouts & 0xfff) == 0) {
        nVar3 = nsync::nsync_time_ms(1);
        local_c0 = (nsync *)nVar3.tv_sec;
        nVar3.tv_sec = nVar3.tv_nsec;
        nVar3 = nsync::nsync_time_sleep(local_c0,nVar3);
        in_stack_ffffffffffffff30 = nVar3.tv_sec;
      }
      nsync::nsync_mu_rlock(&s->mu);
    }
  }
  nsync::nsync_mu_rassert_held(&s->mu);
  nsync::nsync_mu_runlock(&s->mu);
  nsync::nsync_mu_lock(&s->mu);
  s->reader_loops = timeouts + s->reader_loops;
  s->timeouts = s->timeouts;
  s->reader_refs = s->reader_refs - 1;
  if (s->reader_refs == 0) {
    nsync::nsync_cv_signal(&s->reader_refs_is_zero);
  }
  nsync::nsync_mu_assert_held(&s->mu);
  nsync::nsync_mu_unlock(&s->mu);
  return;
}

Assistant:

static void mu_stress_reader_loop (cv_stress_data *s, condition_func condition,
				   const void *condition_arg) {
	uintmax_t loops;
	uintmax_t timeouts = 0;
	nsync_mu_rlock (&s->mu);
	nsync_mu_rassert_held (&s->mu);
	loops = 0;
	while (s->refs != 0) {
		nsync_time abs_deadline;
		nsync_mu_rassert_held (&s->mu);
		abs_deadline = nsync_time_add (nsync_time_now (),
			nsync_time_us (rand () % STRESS_MAX_DELAY_MICROS));
		while (nsync_mu_wait_with_deadline (&s->mu, condition, condition_arg, NULL,
						    abs_deadline, NULL) != 0) {
			nsync_mu_rassert_held (&s->mu);
			s->timeouts++;
			nsync_mu_rassert_held (&s->mu);
			abs_deadline = nsync_time_add (nsync_time_now (),
				nsync_time_us (rand () % STRESS_MAX_DELAY_MICROS));
		}

		nsync_mu_rassert_held (&s->mu);
		loops++;
		if ((loops & 0xf) == 0) {
			nsync_mu_runlock (&s->mu);
			if ((loops & 0xfff) == 0) {
				nsync_time_sleep (nsync_time_ms (1));
			}
			nsync_mu_rlock (&s->mu);
		}
	}
	nsync_mu_rassert_held (&s->mu);
	nsync_mu_runlock (&s->mu);

	nsync_mu_lock (&s->mu);
	s->reader_loops += loops;
	s->timeouts += timeouts;
	s->reader_refs--;
	if (s->reader_refs == 0) {
		nsync_cv_signal (&s->reader_refs_is_zero);
	}
	nsync_mu_assert_held (&s->mu);
	nsync_mu_unlock (&s->mu);
}